

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

var __thiscall cs_impl::runtime_cs_ext::create_co(runtime_cs_ext *this,var *func)

{
  char *pcVar1;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  int iVar5;
  routine_t rVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar7;
  object_method *poVar8;
  callable *pcVar9;
  type_info *ptVar10;
  function *pfVar11;
  long *plVar12;
  initializer_list<cs_impl::any> __l;
  allocator_type local_111;
  shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> local_110;
  any local_100;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_f8;
  uint *local_d8;
  long local_d0;
  uint local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  uint *local_b8;
  long local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  function *local_58;
  function *pfStack_50;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_48;
  
  if (func->mDat == (proxy *)0x0) {
    puVar7 = &void::typeinfo;
  }
  else {
    iVar5 = (*func->mDat->data->_vptr_baseHolder[2])();
    puVar7 = (undefined *)CONCAT44(extraout_var,iVar5);
  }
  pcVar1 = *(char **)(puVar7 + 8);
  if ((pcVar1 != "N2cs8callableE") &&
     ((*pcVar1 == '*' || (iVar5 = strcmp(pcVar1,"N2cs8callableE"), iVar5 != 0)))) {
    if (func->mDat == (proxy *)0x0) {
      puVar7 = &void::typeinfo;
    }
    else {
      iVar5 = (*func->mDat->data->_vptr_baseHolder[2])();
      puVar7 = (undefined *)CONCAT44(extraout_var_00,iVar5);
    }
    pcVar1 = *(char **)(puVar7 + 8);
    if ((pcVar1 == "N2cs13object_methodE") ||
       ((*pcVar1 != '*' && (iVar5 = strcmp(pcVar1,"N2cs13object_methodE"), iVar5 == 0)))) {
      poVar8 = any::const_val<cs::object_method>(func);
      pcVar9 = any::const_val<cs::callable>(&poVar8->callable);
      ptVar10 = std::
                function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                ::target_type(&pcVar9->mFunc);
      pcVar1 = *(char **)(ptVar10 + 8);
      if ((pcVar1 != "N2cs8functionE") &&
         ((*pcVar1 == '*' || (iVar5 = strcmp(pcVar1,"N2cs8functionE"), iVar5 != 0)))) {
        plVar12 = (long *)__cxa_allocate_exception(0x20);
        local_d8 = &local_c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"Only can create coroutine from covscript function.","");
        *plVar12 = (long)(plVar12 + 2);
        if (local_d8 == &local_c8) {
          *(uint *)(plVar12 + 2) = local_c8;
          *(undefined4 *)((long)plVar12 + 0x14) = uStack_c4;
          *(undefined4 *)(plVar12 + 3) = uStack_c0;
          *(undefined4 *)((long)plVar12 + 0x1c) = uStack_bc;
        }
        else {
          *plVar12 = (long)local_d8;
          plVar12[2] = CONCAT44(uStack_c4,local_c8);
        }
        plVar12[1] = local_d0;
        local_d0 = 0;
        local_c8 = local_c8 & 0xffffff00;
        local_d8 = &local_c8;
        __cxa_throw(plVar12,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
      }
      pfVar11 = std::
                function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                ::target<cs::function>(&pcVar9->mFunc);
      local_100.mDat = (poVar8->object).mDat;
      if (local_100.mDat != (proxy *)0x0) {
        (local_100.mDat)->refcount = (local_100.mDat)->refcount + 1;
      }
      __l._M_len = 1;
      __l._M_array = &local_100;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&local_f8,__l,&local_111);
      paVar4 = local_f8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      paVar3 = local_f8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
               super__Vector_impl_data._M_finish;
      paVar2 = local_f8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_f8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_f8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_f8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_88 = (code *)0x0;
      pcStack_80 = (code *)0x0;
      local_58 = pfVar11;
      pfStack_50 = pfVar11;
      local_98._M_unused._M_object = operator_new(0x28);
      *(function **)local_98._M_unused._0_8_ = local_58;
      *(function **)((long)local_98._M_unused._0_8_ + 8) = pfStack_50;
      *(pointer *)((long)local_98._M_unused._0_8_ + 0x10) = paVar2;
      *(pointer *)((long)local_98._M_unused._0_8_ + 0x18) = paVar3;
      *(pointer *)((long)local_98._M_unused._0_8_ + 0x20) = paVar4;
      local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcStack_80 = std::_Function_handler<void_(),_cs_impl::runtime_cs_ext::fiber_callable>::
                   _M_invoke;
      local_88 = std::_Function_handler<void_(),_cs_impl::runtime_cs_ext::fiber_callable>::
                 _M_manager;
      rVar6 = fiber::create(&pfVar11->mContext,(function<void_()> *)&local_98);
      local_110.
      super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_110.
      super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      (local_110.
       super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_110.
       super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_110.
       super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00329348;
      local_110.
      super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               (local_110.
                super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 1);
      *(routine_t *)
       &local_110.
        super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[1]._vptr__Sp_counted_base = rVar6;
      any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>((any *)this,&local_110);
      if (local_110.
          super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_110.
                   super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_48);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_f8);
      any::recycle(&local_100);
    }
    else {
      any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    }
    return (var)(proxy *)this;
  }
  pcVar9 = any::const_val<cs::callable>(func);
  ptVar10 = std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
            ::target_type(&pcVar9->mFunc);
  pcVar1 = *(char **)(ptVar10 + 8);
  if ((pcVar1 != "N2cs8functionE") &&
     ((*pcVar1 == '*' || (iVar5 = strcmp(pcVar1,"N2cs8functionE"), iVar5 != 0)))) {
    plVar12 = (long *)__cxa_allocate_exception(0x20);
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Only can create coroutine from covscript function.","");
    *plVar12 = (long)(plVar12 + 2);
    if (local_b8 == &local_a8) {
      *(uint *)(plVar12 + 2) = local_a8;
      *(undefined4 *)((long)plVar12 + 0x14) = uStack_a4;
      *(undefined4 *)(plVar12 + 3) = uStack_a0;
      *(undefined4 *)((long)plVar12 + 0x1c) = uStack_9c;
    }
    else {
      *plVar12 = (long)local_b8;
      plVar12[2] = CONCAT44(uStack_a4,local_a8);
    }
    plVar12[1] = local_b0;
    local_b0 = 0;
    local_a8 = local_a8 & 0xffffff00;
    local_b8 = &local_a8;
    __cxa_throw(plVar12,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
  }
  pfVar11 = std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
            ::target<cs::function>(&pcVar9->mFunc);
  local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_58 = pfVar11;
  pfStack_50 = pfVar11;
  local_78._M_unused._M_object = operator_new(0x28);
  *(function **)local_78._M_unused._0_8_ = local_58;
  *(function **)((long)local_78._M_unused._0_8_ + 8) = pfStack_50;
  *(pointer *)((long)local_78._M_unused._0_8_ + 0x10) =
       local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)local_78._M_unused._0_8_ + 0x18) =
       local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)local_78._M_unused._0_8_ + 0x20) =
       local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcStack_60 = std::_Function_handler<void_(),_cs_impl::runtime_cs_ext::fiber_callable>::_M_invoke;
  local_68 = std::_Function_handler<void_(),_cs_impl::runtime_cs_ext::fiber_callable>::_M_manager;
  rVar6 = fiber::create(&pfVar11->mContext,(function<void_()> *)&local_78);
  local_110.
  super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_110.
  super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_110.
   super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_110.
   super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_110.
   super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00329348
  ;
  local_110.
  super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (local_110.
          super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi + 1);
  *(routine_t *)
   &local_110.
    super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._vptr__Sp_counted_base = rVar6;
  any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>((any *)this,&local_110);
  if (local_110.
      super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.
               super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_48);
  return (var)(proxy *)this;
}

Assistant:

var create_co(const var &func)
		{
			if (func.type() == typeid(callable)) {
				const cs::callable::function_type &impl_f = func.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(),fiber_callable(fptr)));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				const cs::callable::function_type &impl_f = om.callable.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(), fiber_callable(fptr, {om.object})));
			}
			return null_pointer;
		}